

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

void __thiscall cmLinkedTree<cmDefinitions>::iterator::operator++(iterator *this)

{
  cmLinkedTree<cmDefinitions> *pcVar1;
  pointer puVar2;
  ulong uVar3;
  uint __line;
  ulong uVar4;
  char *__assertion;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmDefinitions> *)0x0) {
    __assertion = "this->Tree";
    __line = 0x3a;
  }
  else {
    puVar2 = (pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(pcVar1->UpPositions).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
    if (uVar4 == ((long)(pcVar1->Data).
                        super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pcVar1->Data).
                       super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x38) {
      uVar3 = this->Position;
      if (uVar4 < uVar3) {
        __assertion = "this->Position <= this->Tree->Data.size()";
        __line = 0x3c;
      }
      else {
        if (uVar3 != 0) {
          this->Position = puVar2[uVar3 - 1];
          return;
        }
        __assertion = "this->Position > 0";
        __line = 0x3d;
      }
    }
    else {
      __assertion = "this->Tree->UpPositions.size() == this->Tree->Data.size()";
      __line = 0x3b;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                ,__line,
                "void cmLinkedTree<cmDefinitions>::iterator::operator++() [T = cmDefinitions]");
}

Assistant:

void operator++()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      this->Position = this->Tree->UpPositions[this->Position - 1];
    }